

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::updateOkButtonText(QFileDialogPrivate *this,bool saveAsOnFolder)

{
  QFileDialog *this_00;
  char cVar1;
  FileMode FVar2;
  AcceptMode AVar3;
  undefined7 in_register_00000031;
  char *s;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000031,saveAsOnFolder) == 0) {
    this_00 = *(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    cVar1 = QFileDialogOptions::isLabelExplicitlySet((DialogLabel)(this->options).value.ptr);
    if (cVar1 != '\0') {
      QFileDialogOptions::labelText((DialogLabel)&QStack_38);
      goto LAB_00498891;
    }
    FVar2 = QFileDialog::fileMode(this_00);
    if (FVar2 == Directory) {
      s = "&Choose";
    }
    else {
      AVar3 = QFileDialog::acceptMode(this_00);
      s = "&Save";
      if (AVar3 == AcceptOpen) {
        s = "&Open";
      }
    }
  }
  else {
    s = "&Open";
  }
  QFileDialog::tr((QString *)&QStack_38,s,(char *)0x0,-1);
LAB_00498891:
  setLabelTextControl(this,Accept,(QString *)&QStack_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::updateOkButtonText(bool saveAsOnFolder)
{
    Q_Q(QFileDialog);
    // 'Save as' at a folder: Temporarily change to "Open".
    if (saveAsOnFolder) {
        setLabelTextControl(QFileDialog::Accept, QFileDialog::tr("&Open"));
    } else if (options->isLabelExplicitlySet(QFileDialogOptions::Accept)) {
        setLabelTextControl(QFileDialog::Accept, options->labelText(QFileDialogOptions::Accept));
        return;
    } else {
        switch (q->fileMode()) {
        case QFileDialog::Directory:
            setLabelTextControl(QFileDialog::Accept, QFileDialog::tr("&Choose"));
            break;
        default:
            setLabelTextControl(QFileDialog::Accept,
                                q->acceptMode() == QFileDialog::AcceptOpen ?
                                    QFileDialog::tr("&Open")  :
                                    QFileDialog::tr("&Save"));
            break;
        }
    }
}